

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandler::engage(&this->m_fatalConditionhandler);
  (**((this->m_activeTestCase->test).
      super___shared_ptr<Catch::ITestInvoker,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_ITestInvoker)();
  FatalConditionHandler::disengage(&this->m_fatalConditionhandler);
  return;
}

Assistant:

void RunContext::invokeActiveTestCase() {
        FatalConditionHandlerGuard _(&m_fatalConditionhandler);
        m_activeTestCase->invoke();
    }